

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O0

void __thiscall
MonahanPlanner::PlanWithCache(MonahanPlanner *this,string *filenameCache,bool computeIfNotCached)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  E *this_00;
  byte in_DL;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream ss;
  ifstream fp;
  bool cached;
  string *in_stack_fffffffffffffbc8;
  MonahanPlanner *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  stringstream local_3d8 [16];
  ostream local_3c8 [392];
  string local_240 [32];
  long local_220 [65];
  byte local_12;
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if ((in_RDI[10].field_2._M_local_buf[0] & 1U) == 0) {
    (**(code **)(*(long *)in_RDI + 0x18))();
  }
  std::operator+(in_RDI,(char *)local_240);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_in);
  std::__cxx11::string::~string(local_240);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  local_12 = (bVar1 & 1) == 0;
  std::ifstream::~ifstream(local_220);
  if (((local_12 & 1) == 0) && ((local_11 & 1) == 0)) {
    std::__cxx11::stringstream::stringstream(local_3d8);
    poVar3 = std::operator<<(local_3c8,"MonahanPlanner::PlanWithCache: ");
    poVar3 = std::operator<<(poVar3,local_10);
    std::operator<<(poVar3," not cached, bailing out");
    this_00 = (E *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    E::E(this_00,in_stack_fffffffffffffbc8);
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  if ((local_12 & 1) == 0) {
    (**(code **)(*(long *)in_RDI + 0x20))();
    Save(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"MonahanPlanner: loading cached ");
    poVar3 = std::operator<<(poVar3,local_10);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Load((MonahanPlanner *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_RDI);
  }
  return;
}

Assistant:

void MonahanPlanner::PlanWithCache(const string &filenameCache,
                                   bool computeIfNotCached)
{
    if(!_m_initialized)
        Initialize();

    bool cached;

    {
        ifstream fp(string(filenameCache + "_t0").c_str());
        if(!fp)
            cached=false;
        else
            cached=true;
    }

    if(!cached && !computeIfNotCached)
    {
        stringstream ss;
        ss << "MonahanPlanner::PlanWithCache: "
           << filenameCache << " not cached, bailing out";
        throw(E(ss.str()));
        return;
    }

    // Couldn't open cache file, so compute
    if(!cached)
    {
        Plan();
        Save(filenameCache);
    }
    else 
    {
        cout << "MonahanPlanner: loading cached " << filenameCache
             << endl;
        Load(filenameCache);
    }
}